

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printNum(JSPrinter *this,Ref node)

{
  Value *pVVar1;
  double *pdVar2;
  char *s;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  pVVar1 = Ref::operator->((Ref *)&this_local);
  pdVar2 = cashew::Value::getNumber(pVVar1);
  if ((*pdVar2 <= 0.0 && *pdVar2 != 0.0) && (this->buffer[this->used - 1] == '-')) {
    emit(this,' ');
  }
  pVVar1 = Ref::operator->((Ref *)&this_local);
  pdVar2 = cashew::Value::getNumber(pVVar1);
  s = numToString(*pdVar2,(bool)(this->finalize & 1));
  emit(this,s);
  return;
}

Assistant:

void printNum(Ref node) {
    if (node->getNumber() < 0 && buffer[used - 1] == '-') {
      emit(' '); // cannot join - and - to --, looks like the -- operator
    }
    emit(numToString(node->getNumber(), finalize));
  }